

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O0

C __thiscall dg::vr::ValueRelations::getAnyConst(ValueRelations *this,Handle h)

{
  bool bVar1;
  Bucket *__uref;
  pointer ppVar2;
  long in_RDI;
  C c;
  V val;
  const_iterator __end2;
  const_iterator __begin2;
  VectorSet<const_llvm::Value_*> *__range2;
  ret_type in_stack_ffffffffffffffb0;
  __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
  local_38 [2];
  _Base_ptr local_28;
  VectorSet<const_llvm::Value_*> *local_20;
  
  __uref = (Bucket *)(in_RDI + 0x88);
  std::reference_wrapper<dg::vr::Bucket_const>::
  reference_wrapper<dg::vr::Bucket_const&,void,dg::vr::Bucket_const*>
            ((reference_wrapper<const_dg::vr::Bucket> *)in_stack_ffffffffffffffb0,__uref);
  local_28 = (_Base_ptr)
             std::
             map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
             ::find((map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
                     *)__uref,(key_type *)0x20953a);
  ppVar2 = std::
           _Rb_tree_const_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>
           ::operator->((_Rb_tree_const_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>
                         *)0x209549);
  local_20 = &ppVar2->second;
  local_38[0]._M_current =
       (Value **)VectorSet<const_llvm::Value_*>::begin((VectorSet<const_llvm::Value_*> *)__uref);
  VectorSet<const_llvm::Value_*>::end((VectorSet<const_llvm::Value_*> *)__uref);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                        *)in_stack_ffffffffffffffb0,
                       (__normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                        *)__uref);
    if (!bVar1) {
      return (C)0x0;
    }
    __gnu_cxx::
    __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
    ::operator*(local_38);
    in_stack_ffffffffffffffb0 =
         llvm::dyn_cast<llvm::ConstantInt,llvm::Value_const>((Value *)in_stack_ffffffffffffffb0);
    if (in_stack_ffffffffffffffb0 != (ret_type)0x0) break;
    __gnu_cxx::
    __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
    ::operator++(local_38);
  }
  return in_stack_ffffffffffffffb0;
}

Assistant:

ValueRelations::C ValueRelations::getAnyConst(Handle h) const {
    for (V val : bucketToVals.find(h)->second) {
        if (C c = llvm::dyn_cast<BareC>(val))
            return c;
    }
    return nullptr;
}